

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAdda<(moira::Instr)119,(moira::Mode)1,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ushort in_SI;
  u32 *in_RDI;
  int dst;
  int src;
  u32 result;
  u32 data;
  u32 ea;
  uint in_stack_ffffffffffffffec;
  undefined6 in_stack_fffffffffffffff0;
  
  uVar2 = in_SI & 7;
  uVar3 = (int)(uint)in_SI >> 9 & 7;
  bVar1 = readOp<(moira::Mode)1,(moira::Size)4,0ul>
                    ((Moira *)CONCAT26(in_SI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
                     (u32 *)((ulong)CONCAT24(in_SI,(int)(uint)in_SI >> 9) & 0x700000007),in_RDI);
  if (bVar1) {
    SEXT<(moira::Size)4>((ulong)in_stack_ffffffffffffffec);
    readA<(moira::Size)4>((Moira *)CONCAT44(uVar2,uVar3),(int)((ulong)in_RDI >> 0x20));
    prefetch<4ul>((Moira *)CONCAT44(uVar2,uVar3));
    (**(code **)(*(long *)in_RDI + 200))(in_RDI,2);
    bVar1 = isRegMode(MODE_AN);
    if ((bVar1) || (bVar1 = isImmMode(MODE_AN), bVar1)) {
      (**(code **)(*(long *)in_RDI + 200))(in_RDI,2);
    }
    writeA<(moira::Size)4>((Moira *)CONCAT44(uVar2,uVar3),(int)((ulong)in_RDI >> 0x20),(u32)in_RDI);
  }
  return;
}

Assistant:

void
Moira::execAdda(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    data = SEXT<S>(data);

    result = (I == ADDA) ? readA(dst) + data : readA(dst) - data;
    prefetch<POLLIPL>();

    sync(2);
    if (S == Word || isRegMode(M) || isImmMode(M)) sync(2);
    writeA(dst, result);
}